

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O0

uint64_t get_uint64t_options(char *json_string,char *option_name,int *result)

{
  json_t *root_00;
  json_t *root;
  int *result_local;
  char *option_name_local;
  char *json_string_local;
  
  *result = -1;
  root_00 = get_root_option_json_object(json_string);
  if (root_00 == (json_t *)0x0) {
    json_string_local = (char *)0xffffffffffffffff;
  }
  else {
    json_string_local = (char *)get_int_options_inner(root_00,option_name,result,1);
  }
  return (uint64_t)json_string_local;
}

Assistant:

uint64_t get_uint64t_options(const char * json_string, const char * option_name, int * result)
{
	json_t * root;

	*result = -1;
	root = get_root_option_json_object(json_string);
	if (!root)
		return -1;
	return (uint64_t)get_int_options_inner(root, option_name, result, 1);
}